

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool __thiscall
tinyexr::CalculateNumTiles
          (tinyexr *this,vector<int,_std::allocator<int>_> *numTiles,int toplevel_size,int size,
          int tile_rounding_mode)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((long)numTiles - (long)this == 0) {
    return true;
  }
  uVar4 = (long)numTiles - (long)this >> 2;
  uVar3 = 0;
  do {
    iVar1 = toplevel_size / (1 << ((byte)uVar3 & 0x1f));
    uVar2 = (uint)(iVar1 << ((byte)uVar3 & 0x1f) < toplevel_size && tile_rounding_mode == 1) + iVar1
    ;
    if ((int)uVar2 < 2) {
      uVar2 = 1;
    }
    if (0x80000000U - size < uVar2) {
      return false;
    }
    *(int *)(this + uVar3 * 4) = (int)(uVar2 + size + -1) / size;
    uVar3 = uVar3 + 1;
    if ((int)uVar3 < 0) {
      return uVar4 <= uVar3;
    }
  } while (uVar3 < uVar4);
  return uVar4 <= uVar3;
}

Assistant:

static bool CalculateNumTiles(std::vector<int>& numTiles,
  int toplevel_size,
  int size,
  int tile_rounding_mode) {
  for (unsigned i = 0; i < numTiles.size(); i++) {
    int l = LevelSize(toplevel_size, int(i), tile_rounding_mode);
    if (l < 0) {
      return false;
    }
    TINYEXR_CHECK_AND_RETURN_C(l <= std::numeric_limits<int>::max() - size + 1, false);

    numTiles[i] = (l + size - 1) / size;
  }
  return true;
}